

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

optional<unsigned_long> __thiscall wasm::WATParser::Token::getI64(Token *this)

{
  ulong uVar1;
  _Storage<unsigned_long,_true> _Var2;
  optional<unsigned_long> oVar3;
  optional<long> oVar4;
  
  oVar3 = getU64(this);
  _Var2._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  if (((undefined1  [16])
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    oVar4 = getS64(this);
    uVar1 = oVar4.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ & 0xffffffffffffff01;
    if (((undefined1  [16])
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      _Var2._M_value =
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
  }
  else {
    uVar1 = CONCAT71(oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._9_7_,1);
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var2._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> Token::getI64() const {
  if (auto n = getU64()) {
    return *n;
  }
  if (auto n = getS64()) {
    return *n;
  }
  return {};
}